

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void __thiscall BloatyTest::CheckConsistency(BloatyTest *this,Options *options)

{
  Rep *pRVar1;
  undefined8 *puVar2;
  internal iVar3;
  FILE *__stream;
  ostream *poVar4;
  void **ppvVar5;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer pcVar6;
  char *in_R9;
  long lVar7;
  long lVar8;
  size_t total_input_size;
  AssertionResult gtest_ar_;
  int rows;
  AssertionResult gtest_ar;
  AssertHelper local_88;
  Message local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertHelper local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_48;
  BloatyTest *local_40;
  Options *local_38;
  
  local_80.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)(0 < (options->base_filename_).super_RepeatedPtrFieldBase.current_size_);
  local_88.data_._0_1_ =
       ((this->output_)._M_t.
        super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>._M_t
        .super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>.
        super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->diff_mode_;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_68,"options.base_filename_size() > 0","output_->diff_mode()",
             (bool *)&local_80,(bool *)&local_88);
  iVar3 = local_68[0];
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_80);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_3ee467 + 0x11;
    }
    else {
      message = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",0x8d
               ,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)CONCAT71(local_80.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_80.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_80.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_80.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if (iVar3 != (internal)0x0) {
    if (((this->output_)._M_t.
         super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>.
         _M_t.
         super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>.
         super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->diff_mode_ == false) {
      local_88.data_ = (AssertHelperData *)0x0;
      pRVar1 = (options->filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar7 = (long)(options->filename_).super_RepeatedPtrFieldBase.current_size_;
      local_40 = this;
      if (lVar7 != 0) {
        lVar8 = 0;
        do {
          puVar2 = *(undefined8 **)((long)ppvVar5 + lVar8);
          __stream = fopen((char *)*puVar2,"rb");
          if (__stream == (FILE *)0x0) {
            local_38 = options;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Couldn\'t get file size for: ",0x1c);
            options = local_38;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)*puVar2,puVar2[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          }
          else {
            fseek(__stream,0,2);
            options = (Options *)ftell(__stream);
            fclose(__stream);
          }
          local_80.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(__stream != (FILE *)0x0);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (__stream == (FILE *)0x0) {
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_68,(internal *)&local_80,
                       (AssertionResult *)"GetFileSize(filename, &size)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                       ,0x93,(char *)CONCAT71(local_68._1_7_,local_68[0]));
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_68._1_7_,local_68[0]) != &local_58) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_68._1_7_,local_68[0]),
                              local_58._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_70.data_._4_4_,(int)local_70.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,(int)local_70.data_) + 8))();
            }
            if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              return;
            }
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_78;
            local_60 = local_78;
            goto LAB_00175006;
          }
          local_88.data_ =
               (AssertHelperData *)
               ((long)(&options->_has_bits_ + 4) + (long)&local_88.data_[-1].message);
          lVar8 = lVar8 + 8;
        } while (lVar7 << 3 != lVar8);
      }
      this = local_40;
      testing::internal::CmpHelperEQ<long,unsigned_long>
                ((internal *)local_68,"top_row_->size.file","total_input_size",
                 &(local_40->top_row_->size).file,(unsigned_long *)&local_88);
      iVar3 = local_68[0];
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message(&local_80);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_3ee467 + 0x11;
        }
        else {
          pcVar6 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                   0x96,pcVar6);
        testing::internal::AssertHelper::operator=(&local_70,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((long *)CONCAT71(local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_80.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_80.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_80.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      if (iVar3 == (internal)0x0) {
        return;
      }
    }
    local_70.data_._0_4_ = 0;
    CheckConsistencyForRow
              (this,this->top_row_,true,
               ((this->output_)._M_t.
                super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                ._M_t.
                super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->diff_mode_,
               (int *)&local_70);
    CheckCSVConsistency(this,(int)local_70.data_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)local_68,"\"TOTAL\"","top_row_->name",(char (*) [6])"TOTAL",
               &this->top_row_->name);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message(&local_80);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_3ee467 + 0x11;
      }
      else {
        pcVar6 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                 0x9c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((long *)CONCAT71(local_80.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_80.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_60;
LAB_00175006:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_60);
    }
  }
  return;
}

Assistant:

void CheckConsistency(const bloaty::Options& options) {
    ASSERT_EQ(options.base_filename_size() > 0, output_->diff_mode());

    if (!output_->diff_mode()) {
      size_t total_input_size = 0;
      for (const auto& filename : options.filename()) {
        uint64_t size;
        ASSERT_TRUE(GetFileSize(filename, &size));
        total_input_size += size;
      }
      ASSERT_EQ(top_row_->size.file, total_input_size);
    }

    int rows = 0;
    CheckConsistencyForRow(*top_row_, true, output_->diff_mode(), &rows);
    CheckCSVConsistency(rows);
    ASSERT_EQ("TOTAL", top_row_->name);
  }